

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SMBusSimulationDataGenerator::OutputProcessCallPMBusRevision(SMBusSimulationDataGenerator *this)

{
  U8 byte;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  U8 pec;
  SMBusSimulationDataGenerator *this_local;
  
  OutputStart(this);
  bVar1 = OutputAddr(this,'C',false,true);
  bVar1 = ""[(int)(uint)bVar1];
  bVar2 = OutputByte(this,0x98,true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  OutputStart(this);
  bVar2 = OutputAddr(this,'C',true,true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  bVar2 = OutputByte(this,'\x11',bVar3);
  byte = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar3) {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputProcessCallPMBusRevision()
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( PMBUS_REVISION ) ];
    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, true ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x11, mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}